

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O3

X509_NAME_ENTRY * X509_NAME_delete_entry(X509_NAME *name,int loc)

{
  OPENSSL_STACK *sk;
  size_t sVar1;
  X509_NAME_ENTRY *pXVar2;
  void *pvVar3;
  int iVar4;
  size_t i;
  size_t where;
  
  if (-1 < loc && name != (X509_NAME *)0x0) {
    sVar1 = OPENSSL_sk_num((OPENSSL_STACK *)name->entries);
    where = (size_t)(uint)loc;
    if (where < sVar1) {
      sk = (OPENSSL_STACK *)name->entries;
      pXVar2 = (X509_NAME_ENTRY *)OPENSSL_sk_delete(sk,where);
      sVar1 = OPENSSL_sk_num(sk);
      name->modified = 1;
      if (sVar1 == where) {
        return pXVar2;
      }
      if (loc == 0) {
        iVar4 = pXVar2->set;
      }
      else {
        pvVar3 = OPENSSL_sk_value(sk,(ulong)(loc - 1));
        iVar4 = *(int *)((long)pvVar3 + 0x10) + 1;
      }
      pvVar3 = OPENSSL_sk_value(sk,where);
      if (sVar1 <= where || *(int *)((long)pvVar3 + 0x10) <= iVar4) {
        return pXVar2;
      }
      do {
        pvVar3 = OPENSSL_sk_value(sk,where);
        *(int *)((long)pvVar3 + 0x10) = *(int *)((long)pvVar3 + 0x10) + -1;
        where = where + 1;
      } while (sVar1 != where);
      return pXVar2;
    }
  }
  return (X509_NAME_ENTRY *)0x0;
}

Assistant:

X509_NAME_ENTRY *X509_NAME_delete_entry(X509_NAME *name, int loc) {
  if (name == NULL || loc < 0 ||
      sk_X509_NAME_ENTRY_num(name->entries) <= (size_t)loc) {
    return NULL;
  }

  STACK_OF(X509_NAME_ENTRY) *sk = name->entries;
  X509_NAME_ENTRY *ret = sk_X509_NAME_ENTRY_delete(sk, loc);
  size_t n = sk_X509_NAME_ENTRY_num(sk);
  name->modified = 1;
  if ((size_t)loc == n) {
    return ret;
  }

  int set_prev;
  if (loc != 0) {
    set_prev = sk_X509_NAME_ENTRY_value(sk, loc - 1)->set;
  } else {
    set_prev = ret->set - 1;
  }
  int set_next = sk_X509_NAME_ENTRY_value(sk, loc)->set;

  // If we removed a singleton RDN, update the RDN indices so they are
  // consecutive again.
  if (set_prev + 1 < set_next) {
    for (size_t i = loc; i < n; i++) {
      sk_X509_NAME_ENTRY_value(sk, i)->set--;
    }
  }
  return ret;
}